

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void selectAddSubqueryTypeInfo(Walker *pWalker,Select *p)

{
  SrcList *pSVar1;
  Parse *pParse;
  int iVar2;
  Select **ppSVar3;
  
  if (-1 < (char)p->selFlags) {
    p->selFlags = p->selFlags | 0x80;
    pSVar1 = p->pSrc;
    if (0 < pSVar1->nSrc) {
      pParse = pWalker->pParse;
      ppSVar3 = &pSVar1->a[0].pSelect;
      iVar2 = 0;
      do {
        if (((((Table *)ppSVar3[-1])->tabFlags & 0x4000) != 0) && (*ppSVar3 != (Select *)0x0)) {
          sqlite3SubqueryColumnTypes(pParse,(Table *)ppSVar3[-1],*ppSVar3,'@');
        }
        iVar2 = iVar2 + 1;
        ppSVar3 = ppSVar3 + 0xd;
      } while (iVar2 < pSVar1->nSrc);
    }
  }
  return;
}

Assistant:

static void selectAddSubqueryTypeInfo(Walker *pWalker, Select *p){
  Parse *pParse;
  int i;
  SrcList *pTabList;
  SrcItem *pFrom;

  if( p->selFlags & SF_HasTypeInfo ) return;
  p->selFlags |= SF_HasTypeInfo;
  pParse = pWalker->pParse;
  assert( (p->selFlags & SF_Resolved) );
  pTabList = p->pSrc;
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab = pFrom->pTab;
    assert( pTab!=0 );
    if( (pTab->tabFlags & TF_Ephemeral)!=0 ){
      /* A sub-query in the FROM clause of a SELECT */
      Select *pSel = pFrom->pSelect;
      if( pSel ){
        sqlite3SubqueryColumnTypes(pParse, pTab, pSel, SQLITE_AFF_NONE);
      }
    }
  }
}